

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitCommentFuncHeader(PrintC *this,Funcdata *fd)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint4 uVar4;
  Comment *this_00;
  Address *pAVar5;
  Address *pAVar6;
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [8];
  Comment comm_2;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  Comment label;
  Comment *comm_1;
  Comment *comm;
  bool extralinebreak;
  Funcdata *fd_local;
  PrintC *this_local;
  
  bVar2 = false;
  CommentSorter::setupHeader(&this->commsorter,0);
  while (bVar3 = CommentSorter::hasNext(&this->commsorter), bVar3) {
    this_00 = CommentSorter::getNext(&this->commsorter);
    uVar1 = (this->super_PrintLanguage).head_comment_type;
    uVar4 = Comment::getType(this_00);
    if ((uVar1 & uVar4) != 0) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,this_00);
      bVar2 = true;
    }
  }
  if ((this->option_unplaced & 1U) != 0) {
    if (bVar2) {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
    bVar2 = false;
    CommentSorter::setupHeader(&this->commsorter,1);
    while (bVar3 = CommentSorter::hasNext(&this->commsorter), bVar3) {
      label._72_8_ = CommentSorter::getNext(&this->commsorter);
      if (!bVar2) {
        pAVar5 = Funcdata::getAddress(fd);
        pAVar6 = Funcdata::getAddress(fd);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a0,"Comments that could not be placed in the function body:",&local_a1);
        Comment::Comment((Comment *)local_80,0x20,pAVar5,pAVar6,0,(string *)local_a0);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,local_80);
        bVar2 = true;
        Comment::~Comment((Comment *)local_80);
      }
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,1,label._72_8_);
    }
  }
  if (((this->super_PrintLanguage).field_0xff & 1) != 0) {
    if (bVar2) {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
    pAVar5 = Funcdata::getAddress(fd);
    pAVar6 = Funcdata::getAddress(fd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"DISPLAY WARNING: Type casts are NOT being printed",&local_129);
    Comment::Comment((Comment *)local_108,0x20,pAVar5,pAVar6,0,(string *)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,local_108);
    bVar2 = true;
    Comment::~Comment((Comment *)local_108);
  }
  if (bVar2) {
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  }
  return;
}

Assistant:

void PrintC::emitCommentFuncHeader(const Funcdata *fd)

{
  bool extralinebreak = false;
  commsorter.setupHeader(CommentSorter::header_basic);
  while(commsorter.hasNext()) {
    Comment *comm = commsorter.getNext();
    if ((head_comment_type & comm->getType())==0) continue;
    emitLineComment(0,comm);
    extralinebreak = true;
  }
  if (option_unplaced) {
    if (extralinebreak)
      emit->tagLine();
    extralinebreak = false;
    commsorter.setupHeader(CommentSorter::header_unplaced);
    while(commsorter.hasNext()) {
      Comment *comm = commsorter.getNext();
      if (!extralinebreak) {
	Comment label(Comment::warningheader,fd->getAddress(),fd->getAddress(),0,
		      "Comments that could not be placed in the function body:");
	emitLineComment(0,&label);
	extralinebreak = true;
      }
      emitLineComment(1,comm);
    }
  }
  if (option_nocasts) {
    if (extralinebreak)
      emit->tagLine();
    Comment comm(Comment::warningheader,fd->getAddress(),fd->getAddress(),0,
		 "DISPLAY WARNING: Type casts are NOT being printed");
    emitLineComment(0,&comm);
    extralinebreak = true;
  }
  if (extralinebreak)
    emit->tagLine();		// Extra linebreak if comment exists
}